

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

bool __thiscall
findstr::writeresult
          (findstr *this,string *origin,char *bufstart,uint64_t offset,char *first,char *last)

{
  undefined8 *puVar1;
  char *fmt;
  char *local_50;
  string local_48;
  
  this->matchcount = this->matchcount + 1;
  if (this->count_only != false) {
    return true;
  }
  if (this->list_only == true) {
    print<std::__cxx11::string_const&>("%s\n",origin);
    return false;
  }
  if (this->verbose == 0) {
    if (this->nameprinted == false) {
      print<std::__cxx11::string_const&>("%s\n\t",origin);
    }
    else {
      print<>(", ");
    }
    local_48._M_dataplus._M_p = first + (offset - (long)bufstart);
    print<long>("%08x",(long *)&local_48);
    this->nameprinted = true;
  }
  else {
    if (this->matchbinary == true) {
      local_50 = first + (offset - (long)bufstart);
      fmt = "%s %08x %-b\n";
    }
    else {
      local_50 = first + (offset - (long)bufstart);
      if (this->pattern_is_guid == true) {
        guidstring_abi_cxx11_(&local_48,(findstr *)first,(uint8_t *)bufstart);
        print<std::__cxx11::string_const&,long,std::__cxx11::string>
                  ("%s %08x %s\n",origin,(long *)&local_50,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        goto LAB_001251d5;
      }
      fmt = "%s %08x %+b\n";
    }
    local_48._M_dataplus._M_p = first;
    local_48._M_string_length = (size_type)last;
    print<std::__cxx11::string_const&,long,Hex::Hexdumper<unsigned_char>>
              (fmt,origin,(long *)&local_50,(Hexdumper<unsigned_char> *)&local_48);
  }
LAB_001251d5:
  if (this->firstmatch != true) {
    return (bool)(this->matchstart ^ 1);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_0014ad00;
  __cxa_throw(puVar1,&stopsearch::typeinfo,std::exception::~exception);
}

Assistant:

bool writeresult(const std::string& origin, const char *bufstart, uint64_t offset, const char *first, const char *last)
    {
        matchcount++;
        if (count_only)
            return true;
        if (list_only) {
            print("%s\n", origin);
            return false;
        }
        else if (verbose) {
            if (matchbinary)
                print("%s %08x %-b\n", origin, offset + first - bufstart, Hex::dumper((const uint8_t*)first, last - first));
            else if (pattern_is_guid)
                print("%s %08x %s\n", origin, offset + first - bufstart, guidstring((const uint8_t*)first));
            else // TODO: add option to output the actual string, instead of the current 'ascdump'
                print("%s %08x %+b\n", origin, offset + first - bufstart, Hex::dumper((const uint8_t*)first, last - first));
        }
        else {
            if (!nameprinted) {
                print("%s\n\t", origin);
            }
            else {
                print(", ");
            }
            print("%08x", offset + first - bufstart);
            nameprinted = true;
        }
        if (firstmatch)
            throw stopsearch();
        if (matchstart) {
            return false;
        }
        return true;
    }